

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.hpp
# Opt level: O3

void __thiscall
Amiga::Chipset::perform<CPU::MC68000::Microcycle<96u>>(Chipset *this,Microcycle<96U> *cycle)

{
  uint uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  uint __fd;
  SlicedInt16 local_c;
  ushort local_a;
  
  __fd = *cycle->address & 0x1fe;
  uVar1 = (cycle->super_MicrocycleOperationStorage<96U>).operation;
  if ((uVar1 & 4) == 0) {
    local_c = *cycle->value;
    local_a = (short)local_c << 8 | (ushort)local_c & 0xff;
    write(this,__fd,(void *)(ulong)(ushort)(&local_c)[uVar1 & 1],1);
    return;
  }
  sVar2 = read(this,__fd,(void *)0x1,in_RCX);
  uVar1 = (cycle->super_MicrocycleOperationStorage<96U>).operation;
  if ((uVar1 & 4) != 0) {
    if ((uVar1 & 2) == 0) {
      (cycle->value->field_1).b =
           (uint8_t)(((uint)sVar2 & 0xffff) >> ((~(byte)*cycle->address & 1) << 3));
    }
    else {
      *cycle->value = SUB82(sVar2,0);
    }
    return;
  }
  __assert_fail("this->operation & Operation::Read",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/../../Processors/68000/68000.hpp"
                ,0x136,"void CPU::MC68000::Microcycle<>::set_value16(uint16_t) const [op = 96]");
}

Assistant:

void perform(const Microcycle &cycle) {
			const uint32_t register_address = *cycle.address & ChipsetAddressMask;
			if(cycle.operation & CPU::MC68000::Operation::Read) {
				cycle.set_value16(read(register_address));
			} else {
				write(register_address, cycle.value16());
			}
		}